

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_period.c
# Opt level: O2

int lyplg_type_sort_time_period(ly_ctx *ctx,lyd_value *val1,lyd_value *val2)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  char *__s;
  char *__s_00;
  size_t sVar4;
  long lVar5;
  long lVar6;
  
  __s = lyd_value_get_canonical(ctx,val1);
  __s_00 = lyd_value_get_canonical(ctx,val2);
  sVar4 = strlen(__s);
  cVar1 = __s[sVar4 - 1];
  sVar4 = strlen(__s_00);
  cVar2 = __s_00[sVar4 - 1];
  lVar5 = strtol(__s,(char **)0x0,10);
  lVar6 = strtol(__s_00,(char **)0x0,10);
  if (cVar1 == cVar2) {
    if (lVar6 < lVar5) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = (uint)(lVar5 != lVar6);
    }
  }
  else {
    uVar3 = 0xffffffff;
    if ((cVar1 != 'm') && (cVar1 != 'w' || cVar2 == 'm')) {
      uVar3 = (uint)(cVar2 != 'h' || cVar1 != 'd') * 2 - 1;
    }
  }
  return uVar3;
}

Assistant:

static int
lyplg_type_sort_time_period(const struct ly_ctx *ctx, const struct lyd_value *val1, const struct lyd_value *val2)
{
    const char *value1, *value2;
    char unit1, unit2;
    long v1, v2;

    value1 = lyd_value_get_canonical(ctx, val1);
    value2 = lyd_value_get_canonical(ctx, val2);

    /* get the units (last character) and the values (all characters except the last one) */
    unit1 = value1[strlen(value1) - 1];
    unit2 = value2[strlen(value2) - 1];
    v1 = strtol(value1, NULL, 10);
    v2 = strtol(value2, NULL, 10);

    /* descending order */
    if (unit1 == unit2) {
        if (v1 > v2) {
            return -1;
        } else if (v1 == v2) {
            return 0;
        } else {
            return 1;
        }
    } else if (unit1 == 'm') {
        return -1;
    } else if ((unit1 == 'w') && (unit2 != 'm')) {
        return -1;
    } else if ((unit1 == 'd') && (unit2 == 'h')) {
        return -1;
    } else {
        return 1;
    }
}